

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

char * json::load<obj_array_var1>(char *in,size_t len,obj_array_var1 *t,int options)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  obj_array_var1 *poVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  property *__i;
  property *ppVar11;
  ulong uVar12;
  property *ppVar13;
  property *ppVar14;
  char *pcVar15;
  char cVar16;
  property *ppVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  size_t sVar22;
  property *__last;
  size_t props_size;
  LoadObject serializer;
  prop_map props;
  size_t local_2608;
  int local_25fc;
  LoadObject local_25f8;
  obj_array_var1 *local_25c0;
  property local_25b8;
  property local_2598 [14];
  char *local_23d8;
  size_t asStack_23d0 [3];
  property local_23b8 [284];
  
  local_2608 = 0;
  cVar16 = *in;
  if (cVar16 != '\0') {
    pcVar21 = in + 1;
    do {
      iVar10 = isspace((int)cVar16);
      if (iVar10 == 0) {
        if (cVar16 == '{') {
          pcVar21 = load_props(pcVar21,in + len,(prop_map *)&local_25b8,&local_2608);
          sVar18 = local_2608;
          if (*pcVar21 != '}') {
            return pcVar21 + -1;
          }
          local_25fc = options;
          local_25c0 = t;
          if (local_2608 != 0) {
            __last = &local_25b8 + local_2608;
            lVar2 = 0x3f;
            if (local_2608 != 0) {
              for (; local_2608 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            std::
            __introsort_loop<json::property*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(json::property_const&,json::property_const&)>>
                      (&local_25b8,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_json::property_&,_const_json::property_&)>)
                       0x14c534);
            if ((long)sVar18 < 0x11) {
              if (sVar18 != 1) {
                ppVar14 = local_2598;
                ppVar11 = &local_25b8;
                do {
                  ppVar17 = ppVar14;
                  uVar1 = (ppVar17->param).len;
                  sVar18 = local_25b8.param.len;
                  if (uVar1 < local_25b8.param.len) {
                    sVar18 = uVar1;
                  }
                  if (sVar18 != 0) {
                    pcVar15 = ppVar11[1].param.str;
                    uVar19 = 0;
                    do {
                      cVar16 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str +
                                        uVar19);
                      if (pcVar15[uVar19] < cVar16) goto LAB_001534ae;
                      if (cVar16 < pcVar15[uVar19]) goto LAB_001534f5;
                      uVar19 = uVar19 + 1;
                    } while (sVar18 != uVar19);
                  }
                  if (uVar1 < local_25b8.param.len) {
LAB_001534ae:
                    local_25f8.props = (prop_map *)(ppVar17->param).str;
                    local_25f8.props_size = (ppVar17->param).len;
                    local_25f8.current = (size_t)(ppVar17->value).str;
                    local_25f8._24_8_ = (ppVar17->value).len;
                    sVar22 = (long)ppVar17 - (long)&local_25b8;
                    memmove((void *)((long)ppVar11 + (0x40 - sVar22)),&local_25b8,sVar22);
                    local_25b8.param.str = (char *)local_25f8.props;
                    local_25b8.param.len = local_25f8.props_size;
                    local_25b8.value.str = (char *)local_25f8.current;
                    local_25b8.value.len = local_25f8._24_8_;
                  }
                  else {
                    pcVar15 = ppVar11[1].param.str;
LAB_001534f5:
                    local_25f8.props = (prop_map *)(ppVar17->value).str;
                    local_25f8.props_size = (ppVar17->value).len;
                    uVar19 = (ppVar11->param).len;
                    uVar12 = uVar19;
                    if (uVar1 < uVar19) {
                      uVar12 = uVar1;
                    }
                    ppVar14 = ppVar17;
                    if (uVar12 != 0) {
                      uVar20 = 0;
                      do {
                        cVar16 = (ppVar11->param).str[uVar20];
                        ppVar13 = ppVar17;
                        if (pcVar15[uVar20] < cVar16) goto LAB_0015353b;
                        if (cVar16 < pcVar15[uVar20]) goto LAB_0015358d;
                        uVar20 = uVar20 + 1;
                      } while (uVar12 != uVar20);
                    }
joined_r0x00153536:
                    ppVar13 = ppVar14;
                    if (uVar1 < uVar19) {
LAB_0015353b:
                      while( true ) {
                        ppVar14 = ppVar11;
                        pcVar3 = (ppVar14->param).str;
                        sVar18 = (ppVar14->param).len;
                        sVar4 = (ppVar14->value).len;
                        (ppVar13->value).str = (ppVar14->value).str;
                        (ppVar13->value).len = sVar4;
                        (ppVar13->param).str = pcVar3;
                        (ppVar13->param).len = sVar18;
                        ppVar11 = ppVar14 + -1;
                        uVar19 = ppVar14[-1].param.len;
                        uVar12 = uVar19;
                        if (uVar1 < uVar19) {
                          uVar12 = uVar1;
                        }
                        if (uVar12 == 0) break;
                        uVar20 = 0;
                        while( true ) {
                          cVar16 = (ppVar11->param).str[uVar20];
                          ppVar13 = ppVar14;
                          if (pcVar15[uVar20] < cVar16) break;
                          if (cVar16 < pcVar15[uVar20]) goto LAB_0015358d;
                          uVar20 = uVar20 + 1;
                          if (uVar12 == uVar20) goto joined_r0x00153536;
                        }
                      }
                      goto joined_r0x00153536;
                    }
LAB_0015358d:
                    (ppVar14->param).str = pcVar15;
                    (ppVar14->param).len = uVar1;
                    (ppVar14->value).str = (char *)local_25f8.props;
                    (ppVar14->value).len = local_25f8.props_size;
                  }
                  ppVar14 = ppVar17 + 1;
                  ppVar11 = ppVar17;
                } while (ppVar17 + 1 != __last);
              }
            }
            else {
              sVar22 = 0x20;
              ppVar11 = &local_25b8;
              do {
                ppVar14 = (property *)((long)&local_25b8.param.str + sVar22);
                uVar1 = *(ulong *)((long)local_2598 + (sVar22 - 0x18));
                sVar18 = local_25b8.param.len;
                if (uVar1 < local_25b8.param.len) {
                  sVar18 = uVar1;
                }
                if (sVar18 != 0) {
                  pcVar15 = (ppVar14->param).str;
                  uVar19 = 0;
                  do {
                    cVar16 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str +
                                      uVar19);
                    if (pcVar15[uVar19] < cVar16) goto LAB_0015326b;
                    if (cVar16 < pcVar15[uVar19]) goto LAB_001532ac;
                    uVar19 = uVar19 + 1;
                  } while (sVar18 != uVar19);
                }
                if (uVar1 < local_25b8.param.len) {
LAB_0015326b:
                  local_25f8.props = (prop_map *)(ppVar14->param).str;
                  local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar22 - 0x18));
                  local_25f8.current = *(undefined8 *)((long)local_2598 + (sVar22 - 0x10));
                  local_25f8._24_8_ = *(size_t *)((long)local_2598 + (sVar22 - 8));
                  memmove(local_2598,&local_25b8,sVar22);
                  local_25b8.param.str = (char *)local_25f8.props;
                  local_25b8.param.len = local_25f8.props_size;
                  local_25b8.value.str = (char *)local_25f8.current;
                  local_25b8.value.len = local_25f8._24_8_;
                }
                else {
                  pcVar15 = (ppVar14->param).str;
LAB_001532ac:
                  local_25f8.props = *(prop_map **)((long)local_2598 + (sVar22 - 0x10));
                  local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar22 - 8));
                  uVar19 = (ppVar11->param).len;
                  uVar12 = uVar19;
                  if (uVar1 < uVar19) {
                    uVar12 = uVar1;
                  }
                  ppVar17 = ppVar14;
                  if (uVar12 != 0) {
                    uVar20 = 0;
                    do {
                      cVar16 = (ppVar11->param).str[uVar20];
                      ppVar13 = ppVar14;
                      if (pcVar15[uVar20] < cVar16) goto LAB_001532f0;
                      if (cVar16 < pcVar15[uVar20]) goto LAB_00153342;
                      uVar20 = uVar20 + 1;
                    } while (uVar12 != uVar20);
                  }
joined_r0x001532eb:
                  ppVar13 = ppVar17;
                  if (uVar1 < uVar19) {
LAB_001532f0:
                    while( true ) {
                      ppVar17 = ppVar11;
                      pcVar3 = (ppVar17->param).str;
                      sVar18 = (ppVar17->param).len;
                      sVar4 = (ppVar17->value).len;
                      (ppVar13->value).str = (ppVar17->value).str;
                      (ppVar13->value).len = sVar4;
                      (ppVar13->param).str = pcVar3;
                      (ppVar13->param).len = sVar18;
                      ppVar11 = ppVar17 + -1;
                      uVar19 = ppVar17[-1].param.len;
                      uVar12 = uVar19;
                      if (uVar1 < uVar19) {
                        uVar12 = uVar1;
                      }
                      if (uVar12 == 0) break;
                      uVar20 = 0;
                      while( true ) {
                        cVar16 = (ppVar11->param).str[uVar20];
                        ppVar13 = ppVar17;
                        if (pcVar15[uVar20] < cVar16) break;
                        if (cVar16 < pcVar15[uVar20]) goto LAB_00153342;
                        uVar20 = uVar20 + 1;
                        if (uVar12 == uVar20) goto joined_r0x001532eb;
                      }
                    }
                    goto joined_r0x001532eb;
                  }
LAB_00153342:
                  (ppVar17->param).str = pcVar15;
                  (ppVar17->param).len = uVar1;
                  (ppVar17->value).str = (char *)local_25f8.props;
                  (ppVar17->value).len = local_25f8.props_size;
                }
                sVar22 = sVar22 + 0x20;
                ppVar11 = ppVar14;
              } while (sVar22 != 0x200);
              ppVar11 = local_23b8;
              do {
                pcVar15 = (ppVar11->param).str;
                uVar1 = (ppVar11->param).len;
                pcVar3 = (ppVar11->value).str;
                sVar18 = (ppVar11->value).len;
                ppVar14 = ppVar11 + -1;
                uVar19 = ppVar11[-1].param.len;
                uVar12 = uVar19;
                if (uVar1 < uVar19) {
                  uVar12 = uVar1;
                }
                ppVar17 = ppVar11;
                if (uVar12 != 0) {
                  uVar20 = 0;
                  do {
                    cVar16 = (ppVar14->param).str[uVar20];
                    ppVar13 = ppVar11;
                    if (pcVar15[uVar20] < cVar16) goto LAB_001533bd;
                    if (cVar16 < pcVar15[uVar20]) goto LAB_00153411;
                    uVar20 = uVar20 + 1;
                  } while (uVar12 != uVar20);
                }
joined_r0x001533b8:
                ppVar13 = ppVar17;
                if (uVar1 < uVar19) {
LAB_001533bd:
                  while( true ) {
                    ppVar17 = ppVar14;
                    pcVar5 = (ppVar17->param).str;
                    sVar4 = (ppVar17->param).len;
                    sVar6 = (ppVar17->value).len;
                    (ppVar13->value).str = (ppVar17->value).str;
                    (ppVar13->value).len = sVar6;
                    (ppVar13->param).str = pcVar5;
                    (ppVar13->param).len = sVar4;
                    ppVar14 = ppVar17 + -1;
                    uVar19 = ppVar17[-1].param.len;
                    uVar12 = uVar19;
                    if (uVar1 < uVar19) {
                      uVar12 = uVar1;
                    }
                    if (uVar12 == 0) break;
                    uVar20 = 0;
                    while( true ) {
                      cVar16 = (ppVar14->param).str[uVar20];
                      ppVar13 = ppVar17;
                      if (pcVar15[uVar20] < cVar16) break;
                      if (cVar16 < pcVar15[uVar20]) goto LAB_00153411;
                      uVar20 = uVar20 + 1;
                      if (uVar12 == uVar20) goto joined_r0x001533b8;
                    }
                  }
                  goto joined_r0x001533b8;
                }
LAB_00153411:
                (ppVar17->param).str = pcVar15;
                (ppVar17->param).len = uVar1;
                (ppVar17->value).str = pcVar3;
                (ppVar17->value).len = sVar18;
                ppVar11 = ppVar11 + 1;
              } while (ppVar11 != __last);
            }
          }
          poVar7 = local_25c0;
          local_25f8.props = (prop_map *)&local_25b8;
          local_25f8.props_size = local_2608;
          local_25f8.current = 0;
          local_25f8.options = local_25fc;
          local_25f8.error_pos = (char *)0x0;
          local_25f8._prev_name = "";
          local_25f8.start = in;
          bVar8 = LoadObject::process<int>(&local_25f8,"val1",&local_25c0->val1);
          bVar9 = LoadObject::process<float>(&local_25f8,"val2",&poVar7->val2);
          if (!bVar8) {
            return local_25f8.error_pos;
          }
          if (!bVar9) {
            return local_25f8.error_pos;
          }
          if (local_25f8.current < local_25f8.props_size) {
            return (&local_25b8)[local_25f8.current].param.str;
          }
          cVar16 = pcVar21[1];
          while( true ) {
            pcVar15 = pcVar21 + 1;
            if (cVar16 == '\0') {
              return pcVar15;
            }
            iVar10 = isspace((int)cVar16);
            if (iVar10 == 0) break;
            cVar16 = pcVar21[2];
            pcVar21 = pcVar15;
          }
          return pcVar15;
        }
        break;
      }
      cVar16 = *pcVar21;
      pcVar21 = pcVar21 + 1;
    } while (cVar16 != '\0');
    in = pcVar21 + -1;
  }
  return in + -1;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}